

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

IdentPtr __thiscall
HashTbl::PidHashNameLenWithHash<unsigned_char>
          (HashTbl *this,uchar *prgch,uchar *end,int32 cch,uint32 luHash)

{
  code *pcVar1;
  HashTbl *pHVar2;
  bool bVar3;
  ULONG UVar4;
  undefined4 *puVar5;
  Ident *pIVar6;
  IdentPtr pIVar7;
  IdentPtr pIVar8;
  uint uVar9;
  int cb;
  uint depth;
  IdentPtr pIVar10;
  uchar *local_50;
  uchar *local_48;
  LPCUTF8 local_40;
  HashTbl *local_38;
  
  local_38 = this;
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x104,"(cch >= 0)","cch >= 0");
    if (!bVar3) goto LAB_00e76a30;
    *puVar5 = 0;
  }
  if (prgch == (uchar *)0x0 && cch != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x105,"(cch == 0 || prgch != nullptr)","cch == 0 || prgch != nullptr");
    if (!bVar3) goto LAB_00e76a30;
    *puVar5 = 0;
  }
  UVar4 = CaseSensitiveComputeHash(prgch,end);
  if (UVar4 != luHash) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x106,"(luHash == CaseSensitiveComputeHash(prgch, end))",
                       "luHash == CaseSensitiveComputeHash(prgch, end)");
    if (!bVar3) {
LAB_00e76a30:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar9 = local_38->m_luMask & luHash;
  pIVar10 = local_38->m_prgpidName[uVar9];
  bVar3 = false;
  local_48 = end;
  local_40 = prgch;
  if (pIVar10 == (IdentPtr)0x0) {
    pIVar10 = (IdentPtr)(local_38->m_prgpidName + uVar9);
    depth = 1;
    pIVar8 = (IdentPtr)0x0;
  }
  else {
    uVar9 = 0;
    do {
      pIVar7 = pIVar10;
      if (((pIVar7->m_luHash == luHash) && (pIVar7->m_cch == cch)) &&
         (bVar3 = utf8::CharsAreEqual((LPCOLESTR)&pIVar7->field_0x22,local_40,end,
                                      doAllowThreeByteSurrogates), bVar3)) {
        pIVar10 = (IdentPtr)0x0;
        pIVar8 = pIVar7;
        goto LAB_00e7693e;
      }
      uVar9 = uVar9 + 1;
      pIVar10 = pIVar7->m_pidNext;
    } while (pIVar7->m_pidNext != (Ident *)0x0);
    pIVar8 = (IdentPtr)0x0;
    pIVar10 = pIVar7;
LAB_00e7693e:
    bVar3 = 5 < uVar9;
    depth = uVar9 + 1;
  }
  pHVar2 = local_38;
  if (pIVar8 != (IdentPtr)0x0) {
    return pIVar8;
  }
  if ((bVar3) && (local_38->m_luMask < local_38->m_luCount)) {
    Grow(local_38);
    pIVar8 = (IdentPtr)(pHVar2->m_prgpidName + (pHVar2->m_luMask & luHash));
    do {
      pIVar10 = pIVar8;
      pIVar8 = pIVar10->m_pidNext;
    } while (pIVar10->m_pidNext != (Ident *)0x0);
  }
  if (local_38->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(local_38->stats,depth);
  }
  pHVar2 = local_38;
  if (((cch != -1) && (cch + 1U < 0x7fffffec)) &&
     ((cb = (cch + 1U) * 2 + 0x28, -1 < cb &&
      (pIVar6 = (Ident *)NoReleaseAllocator::Alloc(&local_38->m_noReleaseAllocator,cb),
      pIVar6 != (Ident *)0x0)))) {
    pIVar10->m_pidNext = pIVar6;
    pHVar2->m_luCount = pHVar2->m_luCount + 1;
    pIVar6->m_pidNext = (Ident *)0x0;
    pIVar6->m_pidRefStack = (PidRefStack *)0x0;
    pIVar6->m_tk = 0x90;
    pIVar6->m_grfid = 0;
    pIVar6->m_luHash = luHash;
    pIVar6->m_cch = cch;
    pIVar6->m_propertyId = -1;
    pIVar6->assignmentState = NotAssigned;
    pIVar6->isUsedInLdElem = false;
    local_50 = local_40;
    utf8::DecodeUnitsIntoAndNullTerminate
              ((char16 *)&pIVar6->field_0x22,&local_50,local_48,doDefault,(bool *)0x0);
    return pIVar6;
  }
  OutOfMemory();
}

Assistant:

IdentPtr HashTbl::PidHashNameLenWithHash(_In_reads_(cch) CharType const * prgch, CharType const * end, int32 cch, uint32 luHash)
{
    Assert(cch >= 0);
    Assert(cch == 0 || prgch != nullptr);
    Assert(luHash == CaseSensitiveComputeHash(prgch, end));

    IdentPtr * ppid = nullptr;
    IdentPtr pid;
    LONG cb;
    int32 bucketCount;


#if PROFILE_DICTIONARY
    int depth = 0;
#endif

    pid = this->FindExistingPid(prgch, end, cch, luHash, &ppid, &bucketCount
#if PROFILE_DICTIONARY
                                , depth
#endif
        );
    if (pid)
    {
        return pid;
    }

    if (bucketCount > BucketLengthLimit && m_luCount > m_luMask)
    {
        Grow();

        // ppid is now invalid because the Grow() moves the entries around.
        // Find the correct ppid by repeating the find of the end of the bucket
        // the new item will be placed in.
        // Note this is similar to the main find loop but does not count nor does it
        // look at the entries because we already proved above the entry is not in the
        // table, we just want to find the end of the bucket.
        ppid = &m_prgpidName[luHash & m_luMask];
        while (*ppid)
            ppid = &(*ppid)->m_pidNext;
    }


#if PROFILE_DICTIONARY
    ++depth;
    if (stats)
        stats->Insert(depth);
#endif

    //Windows OS Bug 1795286 : CENTRAL PREFAST RUN: inetcore\scriptengines\src\src\core\hash.cpp :
    //               'sizeof((*pid))+((cch+1))*sizeof(OLECHAR)' may be smaller than
    //               '((cch+1))*sizeof(OLECHAR)'. This can be caused by integer overflows
    //               or underflows. This could yield an incorrect buffer all
    /* Allocate space for the identifier */
    ULONG Len;

    if (FAILED(ULongAdd(cch, 1, &Len)) ||
        FAILED(ULongMult(Len, sizeof(OLECHAR), &Len)) ||
        FAILED(ULongAdd(Len, sizeof(*pid), &Len)) ||
        FAILED(ULongToLong(Len, &cb)))
    {
        cb = 0;
        OutOfMemory();
    }


    if (nullptr == (pid = (IdentPtr)m_noReleaseAllocator.Alloc(cb)))
        OutOfMemory();

    /* Insert the identifier into the hash list */
    *ppid = pid;

    // Increment the number of entries in the table.
    m_luCount++;

    /* Fill in the identifier record */
    pid->m_pidNext = nullptr;
    pid->m_tk = tkLim;
    pid->m_grfid = fidNil;
    pid->m_luHash = luHash;
    pid->m_cch = cch;
    pid->m_pidRefStack = nullptr;
    pid->m_propertyId = Js::Constants::NoProperty;
    pid->assignmentState = NotAssigned;
    pid->isUsedInLdElem = false;

    HashTbl::CopyString(pid->m_sz, prgch, end);

    return pid;
}